

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::finishSection(WasmBinaryWriter *this,int32_t start)

{
  BufferWithRandomAccess *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  size_type sVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  size_t i_00;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  reference __in;
  type *ptVar11;
  unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
  *this_02;
  reference __in_00;
  type *ptVar12;
  unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
  *this_03;
  reference __in_01;
  SmallVector<unsigned_int,_1UL> *this_04;
  value_type_conflict2 *pvVar13;
  long lVar14;
  value_type_conflict2 *item;
  Iterator __end3;
  Iterator __begin3;
  type *__range3;
  type *locations_2;
  type *__2;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
  local_c0;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
  *__range2_2;
  type *locations_1;
  type *__1;
  _Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
  local_90;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
  *__range2_1;
  type *locations;
  type *_;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
  local_60;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
  *__range2;
  size_t totalAdjustment;
  size_t body;
  size_t i;
  size_t adjustmentForLEBShrinking;
  size_t local_20;
  size_t sizeFieldSize;
  int32_t size;
  int32_t start_local;
  WasmBinaryWriter *this_local;
  
  sizeFieldSize._4_4_ = start;
  _size = this;
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  sizeFieldSize._0_4_ = ((int)sVar4 - sizeFieldSize._4_4_) - 5;
  this_00 = this->o;
  i_00 = (size_t)sizeFieldSize._4_4_;
  LEB<unsigned_int,_unsigned_char>::LEB
            ((LEB<unsigned_int,_unsigned_char> *)((long)&adjustmentForLEBShrinking + 4),
             (uint)sizeFieldSize);
  local_20 = BufferWithRandomAccess::writeAt(this_00,i_00,adjustmentForLEBShrinking._4_4_);
  lVar5 = 5 - local_20;
  if (lVar5 != 0) {
    if (4 < local_20) {
      __assert_fail("sizeFieldSize < MaxLEB32Bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x9a,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)sizeFieldSize._4_4_);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)sizeFieldSize._4_4_);
    lVar14 = (long)(int)(uint)sizeFieldSize;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)sizeFieldSize._4_4_);
    std::move<unsigned_char*,unsigned_char*>(pvVar6 + 5,pvVar7 + lVar14 + 5,pvVar8 + local_20);
    this_01 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,sVar4 - lVar5);
    if (this->sourceMap != (ostream *)0x0) {
      for (body = this->sourceMapLocationsSizeAtSectionStart;
          sVar4 = std::
                  vector<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
                  ::size(&this->sourceMapLocations), body < sVar4; body = body + 1) {
        pvVar9 = std::
                 vector<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
                 ::operator[](&this->sourceMapLocations,body);
        pvVar9->first = pvVar9->first - lVar5;
      }
    }
  }
  sVar1 = this->binaryLocationsSizeAtSectionStart;
  sVar10 = std::
           unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
           ::size(&(this->binaryLocations).expressions);
  if (sVar1 != sVar10) {
    if (this->binaryLocationsSizeAtSectionStart != 0) {
      __assert_fail("binaryLocationsSizeAtSectionStart == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0xab,"void wasm::WasmBinaryWriter::finishSection(int32_t)");
    }
    iVar2 = (int)lVar5 + sizeFieldSize._4_4_ + (int)local_20;
    __end2 = std::
             unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
             ::begin(&(this->binaryLocations).expressions);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
         ::end(&(this->binaryLocations).expressions);
    while (bVar3 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
                              ,&local_60), bVar3) {
      __in = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
             ::operator*(&__end2);
      std::get<0ul,wasm::Expression*const,wasm::BinaryLocations::Span>(__in);
      ptVar11 = std::get<1ul,wasm::Expression*const,wasm::BinaryLocations::Span>(__in);
      ptVar11->start = ptVar11->start - iVar2;
      ptVar11->end = ptVar11->end - iVar2;
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false,_false>
      ::operator++(&__end2);
    }
    this_02 = &(this->binaryLocations).functions;
    __end2_1 = std::
               unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
               ::begin(this_02);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
         ::end(this_02);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                              ,&local_90), bVar3) {
      __in_00 = std::__detail::
                _Node_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
                ::operator*(&__end2_1);
      std::get<0ul,wasm::Function*const,wasm::BinaryLocations::FunctionLocations>(__in_00);
      ptVar12 = std::get<1ul,wasm::Function*const,wasm::BinaryLocations::FunctionLocations>(__in_00)
      ;
      ptVar12->start = ptVar12->start - iVar2;
      ptVar12->declarations = ptVar12->declarations - iVar2;
      ptVar12->end = ptVar12->end - iVar2;
      std::__detail::
      _Node_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
      ::operator++(&__end2_1);
    }
    this_03 = &(this->binaryLocations).delimiters;
    __end2_2 = std::
               unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
               ::begin(this_03);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
         ::end(this_03);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_2.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false>
                              ,&local_c0), bVar3) {
      __in_01 = std::__detail::
                _Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
                ::operator*(&__end2_2);
      std::get<0ul,wasm::Expression*const,wasm::ZeroInitSmallVector<unsigned_int,1ul>>(__in_01);
      this_04 = &std::get<1ul,wasm::Expression*const,wasm::ZeroInitSmallVector<unsigned_int,1ul>>
                           (__in_01)->super_SmallVector<unsigned_int,_1UL>;
      join_0x00000010_0x00000000_ =
           (IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
            )SmallVector<unsigned_int,_1UL>::begin(this_04);
      _item = (IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
               )SmallVector<unsigned_int,_1UL>::end(this_04);
      while (bVar3 = SmallVector<unsigned_int,_1UL>::
                     IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                     ::operator!=((IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                                   *)&__end3.
                                      super_IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                                      .index,(Iterator *)&item), bVar3) {
        pvVar13 = SmallVector<unsigned_int,_1UL>::Iterator::operator*
                            ((Iterator *)
                             &__end3.
                              super_IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                              .index);
        *pvVar13 = *pvVar13 - iVar2;
        SmallVector<unsigned_int,_1UL>::
        IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                      *)&__end3.
                         super_IteratorBase<wasm::SmallVector<unsigned_int,_1UL>,_wasm::SmallVector<unsigned_int,_1UL>::Iterator>
                         .index);
      }
      std::__detail::
      _Node_iterator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_false,_false>
      ::operator++(&__end2_2);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::finishSection(int32_t start) {
  // section size does not include the reserved bytes of the size field itself
  int32_t size = o.size() - start - MaxLEB32Bytes;
  auto sizeFieldSize = o.writeAt(start, U32LEB(size));
  // We can move things back if the actual LEB for the size doesn't use the
  // maximum 5 bytes. In that case we need to adjust offsets after we move
  // things backwards.
  auto adjustmentForLEBShrinking = MaxLEB32Bytes - sizeFieldSize;
  if (adjustmentForLEBShrinking) {
    // we can save some room, nice
    assert(sizeFieldSize < MaxLEB32Bytes);
    std::move(&o[start] + MaxLEB32Bytes,
              &o[start] + MaxLEB32Bytes + size,
              &o[start] + sizeFieldSize);
    o.resize(o.size() - adjustmentForLEBShrinking);
    if (sourceMap) {
      for (auto i = sourceMapLocationsSizeAtSectionStart;
           i < sourceMapLocations.size();
           ++i) {
        sourceMapLocations[i].first -= adjustmentForLEBShrinking;
      }
    }
  }

  if (binaryLocationsSizeAtSectionStart != binaryLocations.expressions.size()) {
    // We added the binary locations, adjust them: they must be relative
    // to the code section.
    assert(binaryLocationsSizeAtSectionStart == 0);
    // The section type byte is right before the LEB for the size; we want
    // offsets that are relative to the body, which is after that section type
    // byte and the the size LEB.
    auto body = start + sizeFieldSize;
    // Offsets are relative to the body of the code section: after the
    // section type byte and the size.
    // Everything was moved by the adjustment, track that. After this,
    // we are at the right absolute address.
    // We are relative to the section start.
    auto totalAdjustment = adjustmentForLEBShrinking + body;
    for (auto& [_, locations] : binaryLocations.expressions) {
      locations.start -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.functions) {
      locations.start -= totalAdjustment;
      locations.declarations -= totalAdjustment;
      locations.end -= totalAdjustment;
    }
    for (auto& [_, locations] : binaryLocations.delimiters) {
      for (auto& item : locations) {
        item -= totalAdjustment;
      }
    }
  }
}